

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

char * __thiscall SimpleStringInternalCache::alloc(SimpleStringInternalCache *this,size_t size)

{
  SimpleStringInternalCacheNode *pSVar1;
  SimpleStringMemoryBlock *pSVar2;
  int iVar3;
  size_t i;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleStringMemoryBlock *pSVar5;
  SimpleStringInternalCacheNode *pSVar6;
  
  if (size < 0x101) {
    pSVar1 = this->cache_;
    lVar4 = 0;
    pSVar6 = pSVar1;
    do {
      if (size <= pSVar6->size_) goto LAB_002b52ff;
      lVar4 = lVar4 + 1;
      pSVar6 = pSVar6 + 1;
    } while (lVar4 != 5);
    lVar4 = 0;
LAB_002b52ff:
    if (pSVar1[lVar4].freeMemoryHead_ == (SimpleStringMemoryBlock *)0x0) {
      lVar4 = 0;
      pSVar6 = pSVar1;
      do {
        if (size <= pSVar6->size_) goto LAB_002b53b0;
        lVar4 = lVar4 + 1;
        pSVar6 = pSVar6 + 1;
      } while (lVar4 != 5);
      lVar4 = 0;
LAB_002b53b0:
      pSVar5 = allocateNewCacheBlockFrom(this,pSVar1 + lVar4);
    }
    else {
      lVar4 = 0;
      pSVar6 = pSVar1;
      do {
        if (size <= pSVar6->size_) goto LAB_002b5328;
        lVar4 = lVar4 + 1;
        pSVar6 = pSVar6 + 1;
      } while (lVar4 != 5);
      lVar4 = 0;
LAB_002b5328:
      pSVar5 = pSVar1[lVar4].freeMemoryHead_;
      pSVar1[lVar4].freeMemoryHead_ = pSVar5->next_;
      pSVar5->next_ = pSVar1[lVar4].usedMemoryHead_;
      pSVar1[lVar4].usedMemoryHead_ = pSVar5;
    }
  }
  else {
    pSVar2 = this->nonCachedAllocations_;
    iVar3 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                      (this->allocator_,0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                       ,0x67);
    pSVar5 = (SimpleStringMemoryBlock *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                      (this->allocator_,size,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                       ,0x68);
    pSVar5->memory_ = (char *)CONCAT44(extraout_var_00,iVar3);
    pSVar5->next_ = pSVar2;
    this->nonCachedAllocations_ = pSVar5;
  }
  return pSVar5->memory_;
}

Assistant:

char* SimpleStringInternalCache::alloc(size_t size)
{
    if (isCached(size)) {
        if (hasFreeBlocksOfSize(size))
            return reserveCachedBlockFrom(getCacheNodeFromSize(size))->memory_;
        else
            return allocateNewCacheBlockFrom(getCacheNodeFromSize(size))->memory_;
    }

    nonCachedAllocations_ = createSimpleStringMemoryBlock(size, nonCachedAllocations_);
    return nonCachedAllocations_->memory_;
}